

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

LBBox3fa * __thiscall embree::SceneGraph::PointSetNode::lbounds(PointSetNode *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  size_type sVar5;
  long in_RSI;
  LBBox3fa *in_RDI;
  float fVar6;
  Vec3fx *x;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  BBox3fa b;
  size_t t;
  avector<BBox3fa> bboxes;
  size_t i;
  size_t i_1;
  size_t i_2;
  size_t in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  ulong *puVar7;
  avector<BBox<Vec3fa>_> local_348;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_328;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_320;
  const_reference local_318;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  undefined8 uStack_2e0;
  ulong local_2d0;
  undefined1 local_2c8 [8];
  ulong local_2c0;
  ulong local_2b8;
  void *local_2b0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_298;
  avector<BBox<Vec3fa>_> *in_stack_fffffffffffffd70;
  LBBox<embree::Vec3fa> *in_stack_fffffffffffffd78;
  ulong local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  LBBox<embree::Vec3fa> **local_1e0;
  undefined8 *local_1d8;
  ulong *local_1d0;
  ulong *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  LBBox<embree::Vec3fa> **local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined1 local_198 [16];
  undefined8 *local_188;
  LBBox<embree::Vec3fa> **local_180;
  ulong *local_178;
  ulong *local_170;
  LBBox<embree::Vec3fa> *local_168;
  size_t sStack_160;
  ulong local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  ulong *local_130;
  LBBox<embree::Vec3fa> *local_128;
  size_t sStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  size_type local_100;
  undefined1 *local_f8;
  size_type local_f0;
  undefined1 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  ulong *local_d0;
  ulong *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  ulong local_a0;
  ulong local_98;
  undefined1 *local_90;
  size_type local_88;
  undefined1 *local_80;
  void *local_78;
  void *local_70;
  long local_68;
  ulong local_50;
  undefined1 *local_48;
  ulong local_40;
  void *local_38;
  undefined1 *local_30;
  const_reference local_10;
  const_reference local_8;
  
  local_100 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      *)(in_RSI + 0x78));
  local_f8 = local_2c8;
  local_2c0 = 0;
  local_2b8 = 0;
  local_2b0 = (void *)0x0;
  local_98 = local_100;
  local_90 = local_f8;
  if (local_100 != 0) {
    local_88 = local_100;
    local_80 = local_f8;
    local_2b0 = alignedMalloc(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
      local_78 = (void *)((long)local_2b0 + local_a0 * 0x20);
      local_68 = (long)local_78 + 0x10;
      local_70 = local_78;
    }
    local_2b8 = local_98;
  }
  local_2c0 = local_2b8;
  for (local_2d0 = 0; uVar4 = local_2d0,
      sVar5 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      *)(in_RSI + 0x78)), uVar4 < sVar5; local_2d0 = local_2d0 + 1) {
    fVar6 = std::numeric_limits<float>::infinity();
    local_2f8 = CONCAT44(fVar6,fVar6);
    uStack_2f0 = CONCAT44(fVar6,fVar6);
    puVar7 = &local_2e8;
    fVar6 = std::numeric_limits<float>::infinity();
    *puVar7 = CONCAT44(fVar6,fVar6) ^ 0x8000000080000000;
    puVar7[1] = CONCAT44(fVar6,fVar6) ^ 0x8000000080000000;
    local_318 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)(in_RSI + 0x78),local_2d0);
    local_328 = &local_318->items[local_318->size_active].field_0;
    for (local_320 = &local_318->items->field_0; local_320 != local_328; local_320 = local_320 + 1)
    {
      local_348.items = (BBox<embree::Vec3fa> *)local_320;
      in_stack_fffffffffffffd70 = &local_348;
      local_298 = local_320;
      in_stack_fffffffffffffd78 = *(LBBox<embree::Vec3fa> **)local_320;
      sStack_120 = *(size_t *)(local_320->m128 + 2);
      local_1d8 = &local_2f8;
      local_1e0 = (LBBox<embree::Vec3fa> **)&local_348;
      local_1a0 = &local_1f8;
      local_118 = local_2f8;
      uStack_110 = uStack_2f0;
      auVar1._8_8_ = uStack_2f0;
      auVar1._0_8_ = local_2f8;
      local_198 = minps(auVar1,(undefined1  [16])*(__m128 *)local_320);
      local_188 = &local_1f8;
      local_1f8 = local_198._0_8_;
      uStack_1f0 = local_198._8_8_;
      local_1c0 = &local_1f8;
      local_2f8 = local_198._0_8_;
      uStack_2f0 = local_198._8_8_;
      local_178 = &local_2e8;
      local_170 = &local_208;
      local_158 = local_2e8;
      uStack_150 = uStack_2e0;
      auVar2._8_8_ = uStack_2e0;
      auVar2._0_8_ = local_2e8;
      local_168 = (LBBox<embree::Vec3fa> *)local_348._0_8_;
      sStack_160 = local_348.size_active;
      auVar3._8_8_ = local_348.size_active;
      auVar3._0_8_ = local_348._0_8_;
      local_148 = maxps(auVar2,auVar3);
      local_130 = &local_208;
      local_208 = local_148._0_8_;
      uStack_200 = local_148._8_8_;
      local_1c8 = &local_2e8;
      local_1d0 = &local_208;
      local_2e8 = local_148._0_8_;
      uStack_2e0 = local_148._8_8_;
      local_1b8 = local_1d8;
      local_1b0 = local_1e0;
      local_1a8 = local_1d8;
      local_180 = local_1e0;
      local_128 = in_stack_fffffffffffffd78;
      local_348._0_8_ = in_stack_fffffffffffffd78;
      local_348.size_active = sStack_120;
    }
    local_f0 = local_2d0;
    local_e8 = local_2c8;
    local_d8 = (undefined8 *)((long)local_2b0 + local_2d0 * 0x20);
    local_e0 = &local_2f8;
    *local_d8 = local_2f8;
    local_d8[1] = uStack_2f0;
    local_d0 = &local_2e8;
    local_c8 = local_d8 + 2;
    *local_c8 = local_2e8;
    local_d8[3] = uStack_2e0;
    local_c0 = local_e0;
    local_b8 = local_d8;
    local_10 = local_318;
    local_8 = local_318;
  }
  LBBox<embree::Vec3fa>::LBBox(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_b0 = local_2c8;
  for (local_50 = 0; local_50 < local_2c0; local_50 = local_50 + 1) {
  }
  local_40 = local_2b8;
  local_38 = local_2b0;
  local_48 = local_b0;
  local_30 = local_b0;
  alignedFree(local_b0);
  *(undefined8 *)(local_b0 + 0x18) = 0;
  *(undefined8 *)(local_b0 + 0x10) = 0;
  *(undefined8 *)(local_b0 + 8) = 0;
  return in_RDI;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        avector<BBox3fa> bboxes(positions.size());
        for (size_t t=0; t<positions.size(); t++) {
          BBox3fa b = empty;
          for (auto& x : positions[t])
            b.extend(x);
          bboxes[t] = b;
        }
        return LBBox3fa(bboxes);
      }